

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O2

LayerInterface * __thiscall yyml::nn::NN::GetLayer(NN *this,string_view name)

{
  iterator iVar1;
  allocator<char> local_41;
  key_type local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_20,&local_41);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->layers_)._M_h,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return *(LayerInterface **)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>,_true>
                 ._M_cur + 0x28);
}

Assistant:

LayerInterface& GetLayer(std::string_view name) {
    LayerInterface* ret = nullptr;
    auto pair = layers_.find(std::string(name));
    if (pair != layers_.end()) {
      ret = pair->second;
    }
    return *ret;
  }